

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_export(ptls_t *tls,ptls_buffer_t *output)

{
  ushort uVar1;
  uint8_t *__s;
  char *pcVar2;
  size_t sVar3;
  ptls_iovec_t negotiated_protocol_00;
  int iVar4;
  size_t len;
  size_t len_00;
  ulong uVar5;
  long lVar6;
  int iVar7;
  byte local_6e;
  byte local_6d;
  ushort local_6c [2];
  size_t local_68;
  size_t local_60;
  char *local_58;
  ptls_iovec_t negotiated_protocol;
  ulong local_40;
  ulong local_38;
  
  __s = (uint8_t *)tls->negotiated_protocol;
  if (__s == (uint8_t *)0x0) {
    len = 0;
  }
  else {
    len = strlen((char *)__s);
  }
  iVar4 = 0x203;
  if (tls->state == PTLS_STATE_SERVER_POST_HANDSHAKE) {
    negotiated_protocol.base = __s;
    negotiated_protocol.len = len;
    if (((tls->traffic_protection).enc.field_0x58 & 1) == 0) {
      pcVar2 = tls->server_name;
      iVar4 = ptls_buffer__do_pushv(output,"",2);
      if (iVar4 == 0) {
        sVar3 = output->off;
        local_6d = tls->field_0x1e8 & 1;
        local_58 = pcVar2;
        iVar4 = ptls_buffer__do_pushv(output,&local_6d,1);
        if (iVar4 == 0) {
          local_6e = (byte)tls->field_0x1e8 >> 1 & 1;
          local_68 = sVar3;
          iVar4 = ptls_buffer__do_pushv(output,&local_6e,1);
          if (iVar4 == 0) {
            local_6c[1] = 0x403;
            iVar4 = ptls_buffer__do_pushv(output,local_6c + 1,2);
            if (iVar4 == 0) {
              uVar1 = tls->cipher_suite->id;
              local_6c[0] = uVar1 << 8 | uVar1 >> 8;
              iVar4 = ptls_buffer__do_pushv(output,local_6c,2);
              if (((iVar4 == 0) &&
                  (iVar4 = ptls_buffer__do_pushv(output,tls->client_random,0x20), iVar4 == 0)) &&
                 (iVar4 = ptls_buffer__do_pushv(output,"",2), pcVar2 = local_58, iVar4 == 0)) {
                local_60 = output->off;
                if (local_58 == (char *)0x0) {
                  len_00 = 0;
                }
                else {
                  len_00 = strlen(local_58);
                }
                iVar4 = ptls_buffer__do_pushv(output,pcVar2,len_00);
                if (iVar4 == 0) {
                  uVar5 = output->off - local_60;
                  iVar7 = 0x20c;
                  iVar4 = iVar7;
                  if (uVar5 < 0x10000) {
                    output->base[local_60 - 2] = (uint8_t)(uVar5 >> 8);
                    output->base[local_60 - 1] = (uint8_t)uVar5;
                    iVar4 = ptls_buffer__do_pushv(output,"",2);
                    if (iVar4 == 0) {
                      sVar3 = output->off;
                      iVar4 = ptls_buffer__do_pushv(output,__s,len);
                      if ((iVar4 == 0) &&
                         (uVar5 = output->off - sVar3, iVar4 = iVar7, uVar5 < 0x10000)) {
                        output->base[sVar3 - 2] = (uint8_t)(uVar5 >> 8);
                        output->base[sVar3 - 1] = (uint8_t)uVar5;
                        iVar4 = ptls_buffer__do_pushv(output,"",2);
                        if (iVar4 == 0) {
                          sVar3 = output->off;
                          iVar4 = ptls_buffer__do_pushv
                                            (output,&(tls->traffic_protection).enc,
                                             tls->cipher_suite->hash->digest_size);
                          if (iVar4 == 0) {
                            uVar5 = (tls->traffic_protection).enc.seq;
                            local_38 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                                       (uVar5 & 0xff0000000000) >> 0x18 |
                                       (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 |
                                       (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 |
                                       uVar5 << 0x38;
                            iVar4 = ptls_buffer__do_pushv(output,&local_38,8);
                            if ((iVar4 == 0) &&
                               (iVar4 = ptls_buffer__do_pushv
                                                  (output,&tls->traffic_protection,
                                                   tls->cipher_suite->hash->digest_size), iVar4 == 0
                               )) {
                              uVar5 = (tls->traffic_protection).dec.seq;
                              local_40 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                                         (uVar5 & 0xff0000000000) >> 0x18 |
                                         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 |
                                         (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 |
                                         uVar5 << 0x38;
                              iVar4 = ptls_buffer__do_pushv(output,&local_40,8);
                              if ((iVar4 == 0) &&
                                 (uVar5 = output->off - sVar3, iVar4 = iVar7, uVar5 < 0x10000)) {
                                output->base[sVar3 - 2] = (uint8_t)(uVar5 >> 8);
                                output->base[sVar3 - 1] = (uint8_t)uVar5;
                                iVar4 = ptls_buffer__do_pushv(output,"",2);
                                if (iVar4 == 0) {
                                  sVar3 = output->off;
                                  for (lVar6 = -2; lVar6 != 0; lVar6 = lVar6 + 1) {
                                    output->base[lVar6 + sVar3] = '\0';
                                  }
                                  uVar5 = output->off - local_68;
                                  iVar4 = iVar7;
                                  if (uVar5 < 0x10000) {
                                    output->base[local_68 - 2] = (uint8_t)(uVar5 >> 8);
                                    output->base[local_68 - 1] = (uint8_t)uVar5;
                                    iVar4 = 0;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      negotiated_protocol_00.len = len;
      negotiated_protocol_00.base = __s;
      iVar4 = export_tls12_params(output,(byte)tls->field_0x1e8 & 1,(byte)tls->field_0x1e8 >> 1 & 1,
                                  tls->cipher_suite,tls->client_random,tls->server_name,
                                  negotiated_protocol_00,&(tls->traffic_protection).enc,
                                  (tls->traffic_protection).enc.secret + 0x20,
                                  (tls->traffic_protection).enc.seq,
                                  (tls->traffic_protection).enc.tls12_enc_record_iv,
                                  &tls->traffic_protection,
                                  (tls->traffic_protection).dec.secret + 0x20,
                                  (tls->traffic_protection).dec.seq);
    }
  }
  return iVar4;
}

Assistant:

int ptls_export(ptls_t *tls, ptls_buffer_t *output)
{
    ptls_iovec_t negotiated_protocol =
        ptls_iovec_init(tls->negotiated_protocol, tls->negotiated_protocol != NULL ? strlen(tls->negotiated_protocol) : 0);
    int ret;

    if (tls->state != PTLS_STATE_SERVER_POST_HANDSHAKE) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    if (ptls_get_protocol_version(tls) == PTLS_PROTOCOL_VERSION_TLS13) {
        export_tls_params(output, tls->is_server, tls->is_psk_handshake, PTLS_PROTOCOL_VERSION_TLS13, tls->cipher_suite,
                          tls->client_random, tls->server_name, negotiated_protocol, {
                              ptls_buffer_pushv(output, tls->traffic_protection.enc.secret, tls->cipher_suite->hash->digest_size);
                              ptls_buffer_push64(output, tls->traffic_protection.enc.seq);
                              ptls_buffer_pushv(output, tls->traffic_protection.dec.secret, tls->cipher_suite->hash->digest_size);
                              ptls_buffer_push64(output, tls->traffic_protection.dec.seq);
                          });
        ret = 0;
    } else {
        if ((ret = export_tls12_params(output, tls->is_server, tls->is_psk_handshake, tls->cipher_suite, tls->client_random,
                                       tls->server_name, negotiated_protocol, tls->traffic_protection.enc.secret,
                                       tls->traffic_protection.enc.secret + PTLS_MAX_SECRET_SIZE, tls->traffic_protection.enc.seq,
                                       tls->traffic_protection.enc.tls12_enc_record_iv, tls->traffic_protection.dec.secret,
                                       tls->traffic_protection.dec.secret + PTLS_MAX_SECRET_SIZE,
                                       tls->traffic_protection.dec.seq)) != 0)
            goto Exit;
    }

Exit:
    return ret;
}